

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O1

int floor1_encode(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_floor1 *look,int *post,
                 int *ilogmask)

{
  vorbis_info_floor1 *pvVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  unsigned_long uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  int bookas [8];
  int maxval [8];
  int out [65];
  uint local_178 [17];
  int local_134;
  uint local_130 [64];
  
  if (post == (int *)0x0) {
    iVar5 = 0;
    oggpack_write(opb,0,1);
    memset(ilogmask,0,(long)(vb->pcmend / 2) << 2);
  }
  else {
    pvVar1 = look->vi;
    iVar5 = look->posts;
    pvVar2 = vb->vd->vi->codec_setup;
    lVar9 = *(long *)((long)pvVar2 + 0x1328);
    if (0 < iVar5) {
      lVar7 = 0;
      do {
        uVar16 = post[lVar7] & 0x7fff;
        switch(pvVar1->mult) {
        case 1:
          uVar16 = uVar16 >> 2;
          break;
        case 2:
          uVar16 = uVar16 >> 3;
          break;
        case 3:
          uVar16 = uVar16 / 0xc;
          break;
        case 4:
          uVar16 = uVar16 >> 4;
        }
        post[lVar7] = post[lVar7] & 0x8000U | uVar16;
        lVar7 = lVar7 + 1;
      } while (iVar5 != lVar7);
    }
    local_178[0x10] = *post;
    uVar8 = (unsigned_long)(int)local_178[0x10];
    local_134 = post[1];
    if (2 < iVar5) {
      lVar7 = 0;
      do {
        iVar6 = look->loneighbor[lVar7];
        iVar10 = look->hineighbor[lVar7];
        uVar16 = post[iVar6] & 0x7fff;
        iVar15 = (post[iVar10] & 0x7fffU) - uVar16;
        iVar11 = -iVar15;
        if (0 < iVar15) {
          iVar11 = iVar15;
        }
        iVar3 = ((pvVar1->postlist[lVar7 + 2] - pvVar1->postlist[iVar6]) * iVar11) /
                (pvVar1->postlist[iVar10] - pvVar1->postlist[iVar6]);
        iVar11 = -iVar3;
        if (-1 < iVar15) {
          iVar11 = iVar3;
        }
        uVar19 = iVar11 + uVar16;
        uVar4 = post[lVar7 + 2];
        if (((short)uVar4 < 0) || (uVar4 == uVar19)) {
          post[lVar7 + 2] = uVar19 | 0x8000;
          local_178[lVar7 + 0x12] = 0;
        }
        else {
          uVar13 = look->quant_q - uVar19;
          if ((int)uVar19 <= (int)uVar13) {
            uVar13 = uVar19;
          }
          uVar4 = uVar4 - uVar19;
          if ((int)uVar4 < 0) {
            if (SBORROW4(uVar4,-uVar13) != (int)(uVar4 + uVar13) < 0) {
              uVar4 = ~uVar4;
              goto LAB_001df9d4;
            }
            uVar13 = ~(uVar4 * 2);
          }
          else if ((int)uVar4 < (int)uVar13) {
            uVar13 = uVar4 * 2;
          }
          else {
LAB_001df9d4:
            uVar13 = uVar13 + uVar4;
          }
          local_178[lVar7 + 0x12] = uVar13;
          post[iVar6] = uVar16;
          post[iVar10] = post[iVar10] & 0x7fff;
        }
        lVar7 = lVar7 + 1;
      } while ((long)iVar5 + -2 != lVar7);
    }
    oggpack_write(opb,1,1);
    look->frames = look->frames + 1;
    iVar5 = ov_ilog(look->quant_q - 1);
    look->postbits = look->postbits + (long)(iVar5 * 2);
    iVar5 = ov_ilog(look->quant_q - 1);
    oggpack_write(opb,uVar8,iVar5);
    uVar8 = (unsigned_long)local_134;
    iVar5 = ov_ilog(look->quant_q - 1);
    oggpack_write(opb,uVar8,iVar5);
    if (0 < pvVar1->partitions) {
      lVar22 = 2;
      lVar7 = 0;
      do {
        iVar5 = pvVar1->partitionclass[lVar7];
        iVar6 = pvVar1->class_subs[iVar5];
        uVar4 = 1 << ((byte)iVar6 & 0x1f);
        uVar16 = pvVar1->class_dim[iVar5];
        local_178[4] = 0;
        local_178[5] = 0;
        local_178[6] = 0;
        local_178[7] = 0;
        local_178[0] = 0;
        local_178[1] = 0;
        local_178[2] = 0;
        local_178[3] = 0;
        if (iVar6 != 0) {
          local_178[0xc] = 0;
          local_178[0xd] = 0;
          local_178[0xe] = 0;
          local_178[0xf] = 0;
          local_178[8] = 0;
          local_178[9] = 0;
          local_178[10] = 0;
          local_178[0xb] = 0;
          if (iVar6 != 0x1f) {
            uVar12 = 1;
            if (1 < (int)uVar4) {
              uVar12 = (ulong)uVar4;
            }
            uVar17 = 0;
            do {
              lVar18 = (long)pvVar1->class_subbook[iVar5][uVar17];
              if (lVar18 < 0) {
                uVar19 = 1;
              }
              else {
                uVar19 = *(uint *)(*(long *)((long)pvVar2 + lVar18 * 8 + 0xb28) + 8);
              }
              local_178[uVar17 + 8] = uVar19;
              uVar17 = uVar17 + 1;
            } while (uVar12 != uVar17);
          }
          if ((int)uVar16 < 1) {
            uVar19 = 0;
          }
          else {
            if ((int)uVar4 < 2) {
              uVar4 = 1;
            }
            uVar12 = 0;
            iVar10 = 0;
            uVar19 = 0;
            do {
              if (iVar6 != 0x1f) {
                uVar17 = 0;
                do {
                  if ((int)local_178[lVar22 + uVar12 + 0x10] < (int)local_178[uVar17 + 8]) {
                    local_178[uVar12] = (uint)uVar17;
                    break;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar4 != uVar17);
              }
              uVar19 = uVar19 | local_178[uVar12] << ((byte)iVar10 & 0x1f);
              iVar10 = iVar10 + iVar6;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar16);
          }
          iVar6 = vorbis_book_encode((codebook *)((long)pvVar1->class_book[iVar5] * 0x60 + lVar9),
                                     uVar19,opb);
          look->phrasebits = look->phrasebits + (long)iVar6;
        }
        if (0 < (int)uVar16) {
          uVar12 = 0;
          do {
            lVar18 = (long)pvVar1->class_subbook[iVar5][(int)local_178[uVar12]];
            if (-1 < lVar18) {
              lVar18 = lVar18 * 0x60;
              if ((long)(int)local_178[lVar22 + uVar12 + 0x10] < *(long *)(lVar9 + 8 + lVar18)) {
                iVar6 = vorbis_book_encode((codebook *)(lVar18 + lVar9),
                                           local_178[lVar22 + uVar12 + 0x10],opb);
                look->postbits = look->postbits + (long)iVar6;
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar16 != uVar12);
        }
        lVar22 = lVar22 + (int)uVar16;
        lVar7 = lVar7 + 1;
      } while (lVar7 < pvVar1->partitions);
    }
    iVar6 = pvVar1->mult * *post;
    uVar16 = 0;
    if (1 < look->posts) {
      lVar9 = *(long *)((long)pvVar2 + vb->W * 8);
      lVar7 = 1;
      uVar4 = 0;
      uVar16 = 0;
      do {
        iVar5 = iVar6;
        uVar19 = uVar4;
        if ((uint)post[look->forward_index[lVar7]] < 0x8000) {
          iVar5 = post[look->forward_index[lVar7]] * pvVar1->mult;
          uVar16 = pvVar1->postlist[look->forward_index[lVar7]];
          iVar11 = iVar5 - iVar6;
          iVar15 = uVar16 - uVar4;
          iVar10 = -iVar11;
          if (0 < iVar11) {
            iVar10 = iVar11;
          }
          iVar14 = (iVar11 / iVar15) * iVar15;
          iVar3 = -iVar14;
          if (iVar14 < 1) {
            iVar3 = iVar14;
          }
          uVar19 = (uint)((ulong)(lVar9 - (lVar9 >> 0x3f)) >> 1);
          uVar13 = uVar16;
          if ((int)uVar19 < (int)uVar16) {
            uVar13 = uVar19;
          }
          if ((int)uVar4 < (int)uVar13) {
            ilogmask[(int)uVar4] = iVar6;
          }
          uVar19 = uVar16;
          if ((int)(uVar4 + 1) < (int)uVar13) {
            lVar22 = 0;
            iVar14 = 0;
            do {
              iVar14 = iVar14 + iVar10 + iVar3;
              uVar20 = 0;
              iVar21 = 0;
              if (iVar15 <= iVar14) {
                uVar20 = iVar11 >> 0x1f | 1;
                iVar21 = iVar15;
              }
              iVar14 = iVar14 - iVar21;
              iVar6 = iVar6 + iVar11 / iVar15 + uVar20;
              ilogmask[(int)(uVar4 + 1) + lVar22] = iVar6;
              lVar22 = lVar22 + 1;
            } while (~uVar4 + uVar13 != (int)lVar22);
          }
        }
        uVar4 = uVar19;
        iVar6 = iVar5;
        lVar7 = lVar7 + 1;
      } while (lVar7 < look->posts);
    }
    iVar5 = 1;
    if ((int)uVar16 < vb->pcmend / 2) {
      lVar9 = (long)(int)uVar16;
      do {
        ilogmask[lVar9] = iVar6;
        lVar9 = lVar9 + 1;
      } while (lVar9 < vb->pcmend / 2);
    }
  }
  return iVar5;
}

Assistant:

int floor1_encode(oggpack_buffer *opb,vorbis_block *vb,
                  vorbis_look_floor1 *look,
                  int *post,int *ilogmask){

  long i,j;
  vorbis_info_floor1 *info=look->vi;
  long posts=look->posts;
  codec_setup_info *ci=vb->vd->vi->codec_setup;
  int out[VIF_POSIT+2];
  static_codebook **sbooks=ci->book_param;
  codebook *books=ci->fullbooks;

  /* quantize values to multiplier spec */
  if(post){
    for(i=0;i<posts;i++){
      int val=post[i]&0x7fff;
      switch(info->mult){
      case 1: /* 1024 -> 256 */
        val>>=2;
        break;
      case 2: /* 1024 -> 128 */
        val>>=3;
        break;
      case 3: /* 1024 -> 86 */
        val/=12;
        break;
      case 4: /* 1024 -> 64 */
        val>>=4;
        break;
      }
      post[i]=val | (post[i]&0x8000);
    }

    out[0]=post[0];
    out[1]=post[1];

    /* find prediction values for each post and subtract them */
    for(i=2;i<posts;i++){
      int ln=look->loneighbor[i-2];
      int hn=look->hineighbor[i-2];
      int x0=info->postlist[ln];
      int x1=info->postlist[hn];
      int y0=post[ln];
      int y1=post[hn];

      int predicted=render_point(x0,x1,y0,y1,info->postlist[i]);

      if((post[i]&0x8000) || (predicted==post[i])){
        post[i]=predicted|0x8000; /* in case there was roundoff jitter
                                     in interpolation */
        out[i]=0;
      }else{
        int headroom=(look->quant_q-predicted<predicted?
                      look->quant_q-predicted:predicted);

        int val=post[i]-predicted;

        /* at this point the 'deviation' value is in the range +/- max
           range, but the real, unique range can always be mapped to
           only [0-maxrange).  So we want to wrap the deviation into
           this limited range, but do it in the way that least screws
           an essentially gaussian probability distribution. */

        if(val<0)
          if(val<-headroom)
            val=headroom-val-1;
          else
            val=-1-(val<<1);
        else
          if(val>=headroom)
            val= val+headroom;
          else
            val<<=1;

        out[i]=val;
        post[ln]&=0x7fff;
        post[hn]&=0x7fff;
      }
    }

    /* we have everything we need. pack it out */
    /* mark nontrivial floor */
    oggpack_write(opb,1,1);

    /* beginning/end post */
    look->frames++;
    look->postbits+=ov_ilog(look->quant_q-1)*2;
    oggpack_write(opb,out[0],ov_ilog(look->quant_q-1));
    oggpack_write(opb,out[1],ov_ilog(look->quant_q-1));


    /* partition by partition */
    for(i=0,j=2;i<info->partitions;i++){
      int class=info->partitionclass[i];
      int cdim=info->class_dim[class];
      int csubbits=info->class_subs[class];
      int csub=1<<csubbits;
      int bookas[8]={0,0,0,0,0,0,0,0};
      int cval=0;
      int cshift=0;
      int k,l;

      /* generate the partition's first stage cascade value */
      if(csubbits){
        int maxval[8]={0,0,0,0,0,0,0,0}; /* gcc's static analysis
                                            issues a warning without
                                            initialization */
        for(k=0;k<csub;k++){
          int booknum=info->class_subbook[class][k];
          if(booknum<0){
            maxval[k]=1;
          }else{
            maxval[k]=sbooks[info->class_subbook[class][k]]->entries;
          }
        }
        for(k=0;k<cdim;k++){
          for(l=0;l<csub;l++){
            int val=out[j+k];
            if(val<maxval[l]){
              bookas[k]=l;
              break;
            }
          }
          cval|= bookas[k]<<cshift;
          cshift+=csubbits;
        }
        /* write it */
        look->phrasebits+=
          vorbis_book_encode(books+info->class_book[class],cval,opb);

#ifdef TRAIN_FLOOR1
        {
          FILE *of;
          char buffer[80];
          sprintf(buffer,"line_%dx%ld_class%d.vqd",
                  vb->pcmend/2,posts-2,class);
          of=fopen(buffer,"a");
          fprintf(of,"%d\n",cval);
          fclose(of);
        }
#endif
      }

      /* write post values */
      for(k=0;k<cdim;k++){
        int book=info->class_subbook[class][bookas[k]];
        if(book>=0){
          /* hack to allow training with 'bad' books */
          if(out[j+k]<(books+book)->entries)
            look->postbits+=vorbis_book_encode(books+book,
                                               out[j+k],opb);
          /*else
            fprintf(stderr,"+!");*/

#ifdef TRAIN_FLOOR1
          {
            FILE *of;
            char buffer[80];
            sprintf(buffer,"line_%dx%ld_%dsub%d.vqd",
                    vb->pcmend/2,posts-2,class,bookas[k]);
            of=fopen(buffer,"a");
            fprintf(of,"%d\n",out[j+k]);
            fclose(of);
          }
#endif
        }
      }
      j+=cdim;
    }

    {
      /* generate quantized floor equivalent to what we'd unpack in decode */
      /* render the lines */
      int hx=0;
      int lx=0;
      int ly=post[0]*info->mult;
      int n=ci->blocksizes[vb->W]/2;

      for(j=1;j<look->posts;j++){
        int current=look->forward_index[j];
        int hy=post[current]&0x7fff;
        if(hy==post[current]){

          hy*=info->mult;
          hx=info->postlist[current];

          render_line0(n,lx,hx,ly,hy,ilogmask);

          lx=hx;
          ly=hy;
        }
      }
      for(j=hx;j<vb->pcmend/2;j++)ilogmask[j]=ly; /* be certain */
      return(1);
    }
  }else{
    oggpack_write(opb,0,1);
    memset(ilogmask,0,vb->pcmend/2*sizeof(*ilogmask));
    return(0);
  }
}